

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFilter.cc
# Opt level: O3

void __thiscall
CountFilter::CountFilter
          (CountFilter *this,string *_kcname,string *_filter_count_name,int _filter_count_max,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_value_count_names,vector<int,_std::allocator<int>_> *_value_count_mins)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  p_Var1 = &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->kcname)._M_dataplus._M_p = (pointer)&(this->kcname).field_2;
  pcVar2 = (_kcname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->kcname,pcVar2,pcVar2 + _kcname->_M_string_length);
  (this->filter_count_name)._M_dataplus._M_p = (pointer)&(this->filter_count_name).field_2;
  pcVar2 = (_filter_count_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filter_count_name,pcVar2,pcVar2 + _filter_count_name->_M_string_length
            );
  this->filter_count_max = _filter_count_max;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->value_count_names,_value_count_names);
  std::vector<int,_std::allocator<int>_>::vector(&this->value_count_mins,_value_count_mins);
  return;
}

Assistant:

CountFilter::CountFilter(std::string _kcname, std::string _filter_count_name, int _filter_count_max, const std::vector<std::string> _value_count_names,const std::vector<int> _value_count_mins):
        kcname(_kcname),
        filter_count_name(_filter_count_name),
        filter_count_max(_filter_count_max),
        value_count_names(_value_count_names),
        value_count_mins(_value_count_mins){}